

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

Result * __thiscall
httplib::Client::Post
          (Result *__return_storage_ptr__,Client *this,string *path,size_t content_length,
          ContentProvider *content_provider,string *content_type)

{
  _Head_base<0UL,_httplib::ClientImpl_*,_false> this_00;
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  this_00._M_head_impl =
       (this->cli_)._M_t.
       super___uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>._M_t.
       super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>.
       super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = content_provider->_M_invoker;
  p_Var1 = (content_provider->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(content_provider->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(content_provider->super__Function_base)._M_functor + 8)
    ;
    (content_provider->super__Function_base)._M_manager = (_Manager_type)0x0;
    content_provider->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  ClientImpl::Post(__return_storage_ptr__,this_00._M_head_impl,path,content_length,
                   (ContentProvider *)&local_28,content_type);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline Result Client::Post(const std::string &path, size_t content_length,
                           ContentProvider content_provider,
                           const std::string &content_type) {
  return cli_->Post(path, content_length, std::move(content_provider),
                    content_type);
}